

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O3

void __thiscall
ScriptMemoryDumper::DumpLargeHeapBlock(ScriptMemoryDumper *this,LargeHeapBlock *heapBlock)

{
  uint32 *puVar1;
  size_t *psVar2;
  size_t sVar3;
  LargeObjectHeader *pLVar4;
  uint index;
  
  if (heapBlock != (LargeHeapBlock *)0x0) {
    puVar1 = &(this->current).finalizeCount;
    *puVar1 = *puVar1 + heapBlock->finalizeCount;
    sVar3 = heapBlock->pageCount;
    (this->current).pageCount = (this->current).pageCount + sVar3;
    psVar2 = &(this->current).totalByteCount;
    *psVar2 = *psVar2 + sVar3 * 0x1000;
    if (heapBlock->allocCount != 0) {
      index = 0;
      do {
        pLVar4 = Memory::LargeHeapBlock::GetHeaderByIndex(heapBlock,index);
        if (pLVar4 != (LargeObjectHeader *)0x0) {
          puVar1 = &(this->current).activeObjectCount;
          *puVar1 = *puVar1 + 1;
          psVar2 = &(this->current).activeObjectByteSize;
          *psVar2 = *psVar2 + pLVar4->objectSize;
        }
        index = index + 1;
      } while (index < heapBlock->allocCount);
    }
  }
  return;
}

Assistant:

void ScriptMemoryDumper::DumpLargeHeapBlock(LargeHeapBlock* heapBlock)
{
    if (heapBlock == nullptr)
        return;

    current.finalizeCount += heapBlock->finalizeCount;
    current.pageCount += heapBlock->GetPageCount();
    current.totalByteCount += heapBlock->GetPageCount() * AutoSystemInfo::PageSize;

    for (uint32 i = 0; i < heapBlock->allocCount; i++)
    {
        Memory::LargeObjectHeader* heapHeader = heapBlock->GetHeaderByIndex(i);
        if (heapHeader != nullptr)
        {
            current.activeObjectCount++;
            current.activeObjectByteSize += heapHeader->objectSize;
        }
    }
}